

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
QLearning::IndexFromMulti
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,QLearning *this,
          int one_dimensional_index,int nn,int depth)

{
  reference pvVar1;
  int iVar2;
  int local_40;
  int i;
  allocator<int> local_2d;
  value_type local_2c;
  undefined1 local_25;
  int local_24;
  int local_20;
  int depth_local;
  int nn_local;
  int one_dimensional_index_local;
  QLearning *this_local;
  vector<int,_std::allocator<int>_> *index;
  
  local_25 = 0;
  local_2c = 0;
  local_24 = depth;
  local_20 = nn;
  depth_local = one_dimensional_index;
  _nn_local = this;
  this_local = (QLearning *)__return_storage_ptr__;
  std::allocator<int>::allocator(&local_2d);
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(long)depth,&local_2c,&local_2d);
  std::allocator<int>::~allocator(&local_2d);
  for (local_40 = 0; local_40 < local_24; local_40 = local_40 + 1) {
    iVar2 = depth_local % local_20;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       (__return_storage_ptr__,(long)local_40);
    *pvVar1 = iVar2;
    depth_local = depth_local / local_20;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> QLearning::IndexFromMulti(int one_dimensional_index, int nn, int depth)
{
    std::vector<int> index(depth, 0);
    for (int i = 0; i < depth; i++)
    {
        index[i] = (one_dimensional_index % nn);
        one_dimensional_index /= nn;
    }
    return index;
}